

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_hud.cpp
# Opt level: O2

void DrawStatLine(int x,int *y,char *prefix,char *string)

{
  FFont *font;
  undefined4 in_register_0000003c;
  int *piVar1;
  int y_00;
  undefined8 in_stack_ffffffffffffff80;
  undefined8 in_stack_ffffffffffffff88;
  undefined8 in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  undefined8 in_stack_ffffffffffffffb0;
  ulong in_stack_ffffffffffffffb8;
  
  font = SmallFont;
  piVar1 = (int *)CONCAT44(in_register_0000003c,x);
  y_00 = (*piVar1 - SmallFont->FontHeight) + 1;
  *piVar1 = y_00;
  DCanvas::DrawText((DCanvas *)screen,font,hudcolor_statnames.Value,5,y_00,(char *)y,0x400013a8,
                    CONCAT44((int)((ulong)in_stack_ffffffffffffff80 >> 0x20),1),
                    CONCAT44((int)((ulong)in_stack_ffffffffffffff88 >> 0x20),0x40001399),
                    CONCAT44((int)((ulong)in_stack_ffffffffffffff90 >> 0x20),hudwidth),
                    CONCAT44((int)((ulong)in_stack_ffffffffffffff98 >> 0x20),0x4000139a),
                    CONCAT44((int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),hudheight),
                    CONCAT44((int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),0x4000138b),
                    CONCAT44((int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),0xc000),
                    in_stack_ffffffffffffffb8 & 0xffffffff00000000);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,hudcolor_stats.Value,statspace + 5,*piVar1,prefix,
                    0x400013a8,1,0x40001399,(ulong)(uint)hudwidth,0x4000139a,(ulong)(uint)hudheight,
                    0x4000138b,0xc000,0);
  return;
}

Assistant:

static void DrawStatLine(int x, int &y, const char *prefix, const char *string)
{
	y -= SmallFont->GetHeight()-1;
	screen->DrawText(SmallFont, hudcolor_statnames, x, y, prefix, 
		DTA_KeepRatio, true,
		DTA_VirtualWidth, hudwidth, DTA_VirtualHeight, hudheight, DTA_Alpha, 0xc000, TAG_DONE);

	screen->DrawText(SmallFont, hudcolor_stats, x+statspace, y, string,
		DTA_KeepRatio, true,
		DTA_VirtualWidth, hudwidth, DTA_VirtualHeight, hudheight, DTA_Alpha, 0xc000, TAG_DONE);
}